

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_bench.c
# Opt level: O0

bool_t bashBench(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  u32 seed;
  uint uVar5;
  size_t sVar6;
  tm_ticks_t tVar7;
  tm_ticks_t tVar8;
  void *state;
  size_t sVar9;
  tm_ticks_t ticks;
  size_t i;
  size_t reps;
  size_t d;
  size_t l;
  octet hash [64];
  octet buf [1024];
  octet combo_state [256];
  octet bash_state [1024];
  octet belt_state [256];
  void *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  uint in_stack_fffffffffffff564;
  uint in_stack_fffffffffffff568;
  uint in_stack_fffffffffffff56c;
  uint in_stack_fffffffffffff570;
  uint in_stack_fffffffffffff574;
  uint in_stack_fffffffffffff578;
  uint in_stack_fffffffffffff57c;
  uint in_stack_fffffffffffff580;
  undefined1 *state_00;
  ulong local_a68;
  ulong local_a58;
  ulong local_a50;
  undefined1 local_608 [1544];
  
  sVar6 = beltHash_keep();
  if ((((sVar6 < 0x101) && (sVar6 = bashPrg_keep(), sVar6 < 0x401)) &&
      (sVar6 = bashHash_keep(), sVar6 < 0x401)) && (sVar6 = prngCOMBO_keep(), sVar6 < 0x101)) {
    state_00 = local_608;
    seed = utilNonce32();
    prngCOMBOStart(state_00,seed);
    prngCOMBOStepR((void *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    printf("bashBench::platform = %s\n","BASH_64");
    sVar6 = 2000;
    beltHashStart((void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    local_a68 = 0;
    tVar7 = tmTicks();
    for (; local_a68 < 2000; local_a68 = local_a68 + 1) {
      beltHashStepH((void *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                    (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    }
    beltHashStepG((octet *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                  in_stack_fffffffffffff558);
    tVar8 = tmTicks();
    state = (void *)(tVar8 - tVar7);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)state >> 10;
    uVar5 = SUB164(auVar1 / ZEXT816(2000),0);
    sVar9 = tmSpeed(CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    printf("bashBench::belt-hash: %3u cpb [%5u kBytes/sec]\n",(ulong)uVar5,sVar9 & 0xffffffff);
    for (local_a50 = 0x80; local_a50 < 0x101; local_a50 = local_a50 + 0x40) {
      bashHashStart((void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (size_t)in_stack_fffffffffffff558);
      local_a68 = 0;
      tVar7 = tmTicks();
      for (; local_a68 < 2000; local_a68 = local_a68 + 1) {
        bashHashStepH((void *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                      CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                      (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
      }
      bashHashStepG((octet *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                    (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
      tVar8 = tmTicks();
      state = (void *)(tVar8 - tVar7);
      in_stack_fffffffffffff57c = (uint)(local_a50 << 1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)state >> 10;
      in_stack_fffffffffffff580 = SUB164(auVar2 / ZEXT816(2000),0);
      sVar9 = tmSpeed(CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                      CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      printf("bashBench::bash%u: %3u cpb [%5u kBytes/sec]\n",(ulong)in_stack_fffffffffffff57c,
             (ulong)in_stack_fffffffffffff580,sVar9 & 0xffffffff);
    }
    for (local_a50 = 0x80; local_a50 < 0x101; local_a50 = local_a50 + 0x40) {
      for (local_a58 = 1; local_a58 < 3; local_a58 = local_a58 + 1) {
        sVar9 = 0;
        bashPrgStart(state,(size_t)state_00,CONCAT44(uVar5,in_stack_fffffffffffff580),
                     (octet *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                     CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                     (octet *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),sVar6);
        bashPrgAbsorbStart((void *)0x108afc);
        local_a68 = 0;
        tVar7 = tmTicks();
        for (; local_a68 < 2000; local_a68 = local_a68 + 1) {
          bashPrgAbsorbStep((void *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                            CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                            (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
        }
        bashPrgSqueeze((void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),sVar9,
                       (void *)0x108b61);
        tVar8 = tmTicks();
        state = (void *)(tVar8 - tVar7);
        in_stack_fffffffffffff570 = (uint)(local_a50 << 1);
        in_stack_fffffffffffff574 = (uint)local_a58;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (ulong)state >> 10;
        in_stack_fffffffffffff578 = SUB164(auVar3 / ZEXT816(2000),0);
        sVar9 = tmSpeed(CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                        CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        printf("bashBench::bash-prg-hash%u%u: %3u cpb [%5u kBytes/sec]\n",
               (ulong)in_stack_fffffffffffff570,(ulong)in_stack_fffffffffffff574,
               (ulong)in_stack_fffffffffffff578,sVar9 & 0xffffffff);
      }
    }
    for (local_a50 = 0x80; local_a50 < 0x101; local_a50 = local_a50 + 0x40) {
      for (local_a58 = 1; local_a58 < 3; local_a58 = local_a58 + 1) {
        bashPrgStart(state,(size_t)state_00,CONCAT44(uVar5,in_stack_fffffffffffff580),
                     (octet *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                     CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                     (octet *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),sVar6);
        bashPrgEncrStart((void *)0x108c5d);
        local_a68 = 0;
        tmTicks();
        for (; local_a68 < 2000; local_a68 = local_a68 + 1) {
          bashPrgEncrStep((void *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                          (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
        }
        bashPrgDecrStart((void *)0x108cb4);
        local_a68 = 0;
        tVar7 = tmTicks();
        for (; local_a68 < 2000; local_a68 = local_a68 + 1) {
          bashPrgDecrStep((void *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                          (void *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
        }
        tVar8 = tmTicks();
        state = (void *)(tVar8 - tVar7);
        in_stack_fffffffffffff564 = (uint)local_a50;
        in_stack_fffffffffffff568 = (uint)local_a58;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (ulong)state >> 0xb;
        in_stack_fffffffffffff56c = SUB164(auVar4 / ZEXT816(2000),0);
        sVar9 = tmSpeed(CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                        CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        printf("bashBench::bash-prg-ae%u%u: %3u cpb [%5u kBytes/sec]\n",
               (ulong)in_stack_fffffffffffff564,(ulong)in_stack_fffffffffffff568,
               (ulong)in_stack_fffffffffffff56c,sVar9 & 0xffffffff);
      }
    }
    return 1;
  }
  return 0;
}

Assistant:

bool_t bashBench()
{
	octet belt_state[256];
	octet bash_state[1024];
	octet combo_state[256];
	octet buf[1024];
	octet hash[64];
	size_t l, d;
	// подготовить память
	if (sizeof(belt_state) < beltHash_keep() ||
		sizeof(bash_state) < bashPrg_keep() ||
		sizeof(bash_state) < bashHash_keep() ||
		sizeof(combo_state) < prngCOMBO_keep())
		return FALSE;
	// заполнить buf псевдослучайными числами
	prngCOMBOStart(combo_state, utilNonce32());
	prngCOMBOStepR(buf, sizeof(buf), combo_state);
	// платформа
	printf("bashBench::platform = %s\n", bash_platform);
	// оценить скорость хэширования
	{
		const size_t reps = 2000;
		size_t i;
		tm_ticks_t ticks;
		// эксперимент c belt
		beltHashStart(belt_state);
		for (i = 0, ticks = tmTicks(); i < reps; ++i)
			beltHashStepH(buf, sizeof(buf), belt_state);
		beltHashStepG(hash, belt_state);
		ticks = tmTicks() - ticks;
		printf("bashBench::belt-hash: %3u cpb [%5u kBytes/sec]\n",
			(unsigned)(ticks / 1024 / reps),
			(unsigned)tmSpeed(reps, ticks));
		// эксперимент c bashHashLLL
		for (l = 128; l <= 256; l += 64)
		{
			bashHashStart(bash_state, l);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashHashStepH(buf, sizeof(buf), bash_state);
			bashHashStepG(hash, l / 4, bash_state);
			ticks = tmTicks() - ticks;
			printf("bashBench::bash%u: %3u cpb [%5u kBytes/sec]\n",
				(unsigned)(2 * l),
				(unsigned)(ticks / sizeof(buf) / reps),
				(unsigned)tmSpeed(reps, ticks));
		}
		// эксперимент с bash-prg-hashLLLD
		for (l = 128; l <= 256; l += 64)
		for (d = 1; d <= 2; ++d)
		{
			bashPrgStart(bash_state, l, d, hash, l / 8, 0, 0);
			bashPrgAbsorbStart(bash_state);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashPrgAbsorbStep(buf, 1024, bash_state);
			bashPrgSqueeze(hash, l / 4, bash_state);
			ticks = tmTicks() - ticks;
			printf("bashBench::bash-prg-hash%u%u: %3u cpb [%5u kBytes/sec]\n",
				(unsigned)(2 * l), (unsigned)d,
				(unsigned)(ticks / sizeof(buf) / reps),
				(unsigned)tmSpeed(reps, ticks));
		}
		// эксперимент с bash-prg-aeLLLD
		for (l = 128; l <= 256; l += 64)
		for (d = 1; d <= 2; ++d)
		{
			bashPrgStart(bash_state, l, d, 0, 0, hash, l / 8);
			bashPrgEncrStart(bash_state);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashPrgEncrStep(buf, 1024, bash_state);
			bashPrgDecrStart(bash_state);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashPrgDecrStep(buf, 1024, bash_state);
			ticks = tmTicks() - ticks;
			printf("bashBench::bash-prg-ae%u%u: %3u cpb [%5u kBytes/sec]\n",
				(unsigned)l, (unsigned)d,
				(unsigned)(ticks / (2 * sizeof(buf)) / reps),
				(unsigned)tmSpeed(2 * reps, ticks));
		}
	}
	// все нормально
	return TRUE;
}